

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveIncbin::Encode(CDirectiveIncbin *this)

{
  FileManager *this_00;
  size_t sVar1;
  byte *pbVar2;
  void *__buf;
  string local_58;
  undefined1 local_28 [8];
  ByteArray data;
  CDirectiveIncbin *this_local;
  
  if (this->size != 0) {
    data.allocatedSize_ = (size_t)this;
    ByteArray::fromFile((ByteArray *)local_28,&this->fileName,this->start,this->size);
    sVar1 = ByteArray::size((ByteArray *)local_28);
    this_00 = g_fileManager;
    if ((long)(int)sVar1 == this->size) {
      pbVar2 = ByteArray::data((ByteArray *)local_28,0);
      __buf = (void *)ByteArray::size((ByteArray *)local_28);
      FileManager::write(this_00,(int)pbVar2,__buf,(size_t)this);
    }
    else {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_58,&this->fileName);
      Logger::printError<std::__cxx11::string>
                ((Logger *)0x1,0x229500,(char *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::__cxx11::string::~string((string *)&local_58);
    }
    ByteArray::~ByteArray((ByteArray *)local_28);
  }
  return;
}

Assistant:

void CDirectiveIncbin::Encode() const
{
	if (size != 0)
	{
		ByteArray data = ByteArray::fromFile(fileName,(long)start,size);
		if ((int) data.size() != size)
		{
			Logger::printError(Logger::Error, "Could not read file \"%s\"",fileName.u8string());
			return;
		}
		g_fileManager->write(data.data(),data.size());
	}
}